

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O2

void __thiscall
Iir::ChebyshevI::HighPassBase::setup
          (HighPassBase *this,int order,double cutoffFrequency,double rippleDb)

{
  AnalogLowPass *this_00;
  LayoutBase *digital;
  HighPassTransform local_20;
  
  this_00 = &(this->super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).m_analogProto;
  AnalogLowPass::design(this_00,order,rippleDb);
  digital = &(this->super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.
             m_digitalProto;
  HighPassTransform::HighPassTransform(&local_20,cutoffFrequency,digital,&this_00->super_LayoutBase)
  ;
  Cascade::setLayout((Cascade *)this,digital);
  return;
}

Assistant:

void HighPassBase::setup (int order,
                          double cutoffFrequency,
                          double rippleDb)
{
  m_analogProto.design (order, rippleDb);

  HighPassTransform (cutoffFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}